

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::retrieve(Buffer *this,off_t len)

{
  off_t oVar1;
  off_t *poVar2;
  
  if (-1 < len) {
    oVar1 = size(this);
    if (oVar1 != 0) {
      oVar1 = size(this);
      poVar2 = &this->leftIndex_;
      if (oVar1 < len) {
        *poVar2 = 0;
        this->rightIndex_ = 0;
      }
      else {
        *poVar2 = *poVar2 + len;
      }
    }
    return;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0xe8,"void Liby::Buffer::retrieve(off_t)");
}

Assistant:

void Buffer::retrieve(off_t len) {
    assert(len >= 0);
    if (size() == 0) {
        return;
    } else if (len > size()) {
        leftIndex_ = rightIndex_ = 0;
    } else {
        leftIndex_ += len;
    }
    //    if (size() < capacity_ / 2) {
    //        Buffer b(*this);
    //        swap(b);
    //    }
}